

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenUnsafeBufferPointer(SwiftGenerator *this,FieldDef *field)

{
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  FieldDef *local_18;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  local_18 = field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"functionName",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"withUnsafePointerTo",&local_91);
  Namer::Variable<flatbuffers::FieldDef>(&local_70,&(this->namer_).super_Namer,&local_90,local_18);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "{{ACCESS_TYPE}} func {{functionName}}<T>(_ body: (UnsafeRawBufferPointer) throws -> T) rethrows -> T? { return try {{ACCESS}}.withUnsafePointerToSlice(at: {{TABLEOFFSET}}.{{OFFSET}}.v, body: body) }"
             ,&local_b9);
  CodeWriter::operator+=(&this->code_,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void GenUnsafeBufferPointer(const FieldDef &field) {
    code_.SetValue("functionName",
                   namer_.Variable("withUnsafePointerTo", field));
    code_ +=
        "{{ACCESS_TYPE}} func {{functionName}}<T>(_ body: "
        "(UnsafeRawBufferPointer) throws -> T) rethrows -> T? { return try "
        "{{ACCESS}}.withUnsafePointerToSlice(at: {{TABLEOFFSET}}.{{OFFSET}}.v, "
        "body: body) }";
  }